

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprListSetSpan(Parse *pParse,ExprList *pList,ExprSpan *pSpan)

{
  int iVar1;
  sqlite3 *db;
  ExprList_item *pEVar2;
  char *__src;
  char *__dest;
  size_t __n;
  
  if (pList == (ExprList *)0x0) {
    return;
  }
  db = pParse->db;
  pEVar2 = pList->a;
  iVar1 = pList->nExpr;
  sqlite3DbFree(db,pEVar2[(long)iVar1 + -1].zSpan);
  __src = pSpan->zStart;
  if (__src != (char *)0x0) {
    __n = (size_t)(*(int *)&pSpan->zEnd - (int)__src);
    __dest = (char *)sqlite3DbMallocRaw(db,__n + 1);
    if (__dest != (char *)0x0) {
      memcpy(__dest,__src,__n);
      __dest[__n] = '\0';
      goto LAB_00144a4b;
    }
  }
  __dest = (char *)0x0;
LAB_00144a4b:
  pEVar2[(long)iVar1 + -1].zSpan = __dest;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprListSetSpan(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to add the span. */
  ExprSpan *pSpan         /* The span to be added */
){
  sqlite3 *db = pParse->db;
  assert( pList!=0 || db->mallocFailed!=0 );
  if( pList ){
    struct ExprList_item *pItem = &pList->a[pList->nExpr-1];
    assert( pList->nExpr>0 );
    assert( db->mallocFailed || pItem->pExpr==pSpan->pExpr );
    sqlite3DbFree(db, pItem->zSpan);
    pItem->zSpan = sqlite3DbStrNDup(db, (char*)pSpan->zStart,
                                    (int)(pSpan->zEnd - pSpan->zStart));
  }
}